

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

void __thiscall
testing::internal::TypedExpectation<void_(SDL_Renderer_*)>::TypedExpectation
          (TypedExpectation<void_(SDL_Renderer_*)> *this,
          FunctionMocker<void_(SDL_Renderer_*)> *owner,char *a_file,int a_line,string *a_source_text
          ,ArgumentMatcherTuple *m)

{
  VTable *pVVar1;
  SharedPayloadBase *pSVar2;
  
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_00328d00;
  this->owner_ = owner;
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<SDL_Renderer_*>_>.
  super__Head_base<0UL,_testing::Matcher<SDL_Renderer_*>,_false>._M_head_impl.
  super_MatcherBase<SDL_Renderer_*>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface
       = (_func_int **)&PTR__MatcherBase_003280f0;
  pVVar1 = (m->super__Tuple_impl<0UL,_testing::Matcher<SDL_Renderer_*>_>).
           super__Head_base<0UL,_testing::Matcher<SDL_Renderer_*>,_false>._M_head_impl.
           super_MatcherBase<SDL_Renderer_*>.vtable_;
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<SDL_Renderer_*>_>.
  super__Head_base<0UL,_testing::Matcher<SDL_Renderer_*>,_false>._M_head_impl.
  super_MatcherBase<SDL_Renderer_*>.vtable_ = pVVar1;
  pSVar2 = (m->super__Tuple_impl<0UL,_testing::Matcher<SDL_Renderer_*>_>).
           super__Head_base<0UL,_testing::Matcher<SDL_Renderer_*>,_false>._M_head_impl.
           super_MatcherBase<SDL_Renderer_*>.buffer_.shared;
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<SDL_Renderer_*>_>.
  super__Head_base<0UL,_testing::Matcher<SDL_Renderer_*>,_false>._M_head_impl.
  super_MatcherBase<SDL_Renderer_*>.buffer_.shared = pSVar2;
  if ((pVVar1 != (VTable *)0x0) &&
     (pVVar1->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<SDL_Renderer_*>_>.
  super__Head_base<0UL,_testing::Matcher<SDL_Renderer_*>,_false>._M_head_impl.
  super_MatcherBase<SDL_Renderer_*>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface
       = (_func_int **)&PTR__MatcherBase_00328148;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<SDL_Renderer_*>_&>.vtable_ =
       (VTable *)
       MatcherBase<std::tuple<SDL_Renderer*>const&>::
       GetVTable<testing::internal::MatcherBase<std::tuple<SDL_Renderer*>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<SDL_Renderer_*>_&>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00328d48;
  *(undefined8 *)&(this->repeated_action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->repeated_action_).fun_.super__Function_base._M_functor + 8) = 0;
  (this->repeated_action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->repeated_action_).fun_._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

TypedExpectation(FunctionMocker<F>* owner, const char* a_file, int a_line,
                   const std::string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that causes ambiguity between
        // Matcher's copy and move constructor for some argument types.
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}